

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_u_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  ushort *puVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  
  lVar4 = (ulong)wd * 0x10;
  lVar6 = (ulong)ws * 0x10;
  lVar5 = (ulong)wt * 0x10;
  uVar3 = *(ushort *)((env->active_fpu).fpr + wt);
  pfVar1 = (env->active_fpu).fpr + ws;
  sVar7 = uVar3 + *(ushort *)pfVar1;
  if (CARRY2(uVar3,*(ushort *)pfVar1)) {
    sVar7 = -1;
  }
  *(short *)((env->active_fpu).fpr + wd) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 2);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 2);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 2) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 4);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 4);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 4) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 6);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 6);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 6) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 8);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 8);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 8) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 10);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 10);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 10) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 0xc);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 0xc) = sVar7;
  uVar3 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 0xe);
  puVar2 = (ushort *)((long)(env->active_fpu).fpr + lVar6 + 0xe);
  sVar7 = uVar3 + *puVar2;
  if (CARRY2(uVar3,*puVar2)) {
    sVar7 = -1;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar4 + 0xe) = sVar7;
  return;
}

Assistant:

void helper_msa_adds_u_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_adds_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_adds_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_adds_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_adds_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_adds_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_adds_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_adds_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_adds_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}